

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

SQUnsignedInteger TranslateIndex(SQObjectPtr *idx)

{
  if ((idx->super_SQObject)._type == OT_INTEGER) {
    return (SQUnsignedInteger)(idx->super_SQObject)._unVal.pTable;
  }
  return 0;
}

Assistant:

SQUnsignedInteger TranslateIndex(const SQObjectPtr &idx)
{
    switch(sq_type(idx)){
        case OT_NULL:
            return 0;
        case OT_INTEGER:
            return (SQUnsignedInteger)_integer(idx);
        default: assert(0); break;
    }
    return 0;
}